

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

int find_lower_bound(__m128i *PrevHi,__m128i *PrevLow,uint32_t key,uint32_t *presult)

{
  ulong uVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar8 = vpbroadcastd_avx512vl();
  auVar9._8_4_ = 0x80000000;
  auVar9._0_8_ = 0x8000000080000000;
  auVar9._12_4_ = 0x80000000;
  auVar9 = vpxord_avx512vl((undefined1  [16])*PrevLow,auVar9);
  uVar1 = vpcmpgtd_avx512vl(auVar8,auVar9);
  if ((~(byte)(uVar1 & 0xf) & 0xf) == 0) {
    auVar5._8_4_ = 0x80000000;
    auVar5._0_8_ = 0x8000000080000000;
    auVar5._12_4_ = 0x80000000;
    auVar9 = vpxord_avx512vl((undefined1  [16])*PrevHi,auVar5);
    uVar2 = vpcmpgtd_avx512vl(auVar8,auVar9);
    uVar6 = (uint)uVar2 & 0xf;
    iVar7 = 4;
    PrevLow = PrevHi;
  }
  else {
    uVar6 = (uint)(uVar1 & 0xf);
    iVar7 = 0;
  }
  iVar3 = 0;
  for (uVar4 = uVar6 ^ 0xf; (uVar4 & 1) == 0; uVar4 = uVar4 >> 1 | 0x80000000) {
    iVar3 = iVar3 + 1;
  }
  auVar9 = vpshufb_avx((undefined1  [16])*PrevLow,*(undefined1 (*) [16])("" + ((uVar6 ^ 0xf) << 4)))
  ;
  *presult = auVar9._0_4_;
  return iVar3 + iVar7;
}

Assistant:

static inline int find_lower_bound(__m128i *PrevHi, __m128i *PrevLow,
                                   uint32_t key, uint32_t *presult) {
  int offset = 0;
  int s;

#if 0
    // scalar code:
    uint32_t out[8];
    _write_avx(out, *PrevLow);
    _write_avx(out + 4, *PrevHi);
    s = std::lower_bound(out, out + 8, key) - out;
    *presult = out[s];
    return (s);
#endif

  uint32_t mask;
  __m128i key4 = _mm_set1_epi32(key - 2147483648U);
  __m128i conversion = _mm_set1_epi32(2147483648U);
  __m128i tmp = _mm_sub_epi32(*PrevLow, conversion);
  mask = _mm_movemask_ps(_mm_castsi128_ps(_mm_cmplt_epi32(tmp, key4)));
  __m128i *out = PrevLow;
  // not found in PrevLow? then try PrevHi
  if (mask == 15) {
    tmp = _mm_sub_epi32(*PrevHi, conversion);
    mask = _mm_movemask_ps(_mm_castsi128_ps(_mm_cmplt_epi32(tmp, key4)));
    out = PrevHi;
    offset = 4;
  }
  // there MUST be a result!
  assert(mask != 15);
  const __m128i p = _mm_shuffle_epi8(*out, streamvbyte_shuffle_mask[mask ^ 15]);
  s = __builtin_ctz(mask ^ 15);
  *presult = _mm_cvtsi128_si32(p);

  return (offset + s);
}